

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetConstraints(void *arkode_mem,N_Vector constraints)

{
  int iVar1;
  ARKodeMem in_RSI;
  ARKodeMem in_RDI;
  N_Vector tmpl;
  ARKodeMem ark_mem;
  sunrealtype temptest;
  ARKodeMem in_stack_ffffffffffffffe0;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x592,"ARKodeSetConstraints",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if ((in_RDI->step_supports_adaptive == 0) && (in_RSI != (ARKodeMem)0x0)) {
    arkProcessError(in_RDI,-0x30,0x59b,"ARKodeSetConstraints",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"time-stepping module does not support temporal adaptivity");
    local_4 = -0x30;
  }
  else if (in_RSI == (ARKodeMem)0x0) {
    arkFreeVec(in_stack_ffffffffffffffe0,(N_Vector *)in_RDI);
    in_RDI->constraintsSet = 0;
    local_4 = 0;
  }
  else if ((((*(long *)((long)in_RSI->uround + 0x70) == 0) ||
            (*(long *)((long)in_RSI->uround + 0xa0) == 0)) ||
           (*(long *)((long)in_RSI->uround + 0xd0) == 0)) ||
          ((*(long *)((long)in_RSI->uround + 0xe0) == 0 ||
           (*(long *)((long)in_RSI->uround + 0xe8) == 0)))) {
    arkProcessError(in_RDI,-0x16,0x5ae,"ARKodeSetConstraints",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"A required vector operation is not implemented.");
    local_4 = -0x16;
  }
  else {
    tmpl = (N_Vector)N_VMaxNorm(in_RSI);
    if ((2.5 < (double)tmpl) || ((double)tmpl < 0.5)) {
      arkProcessError(in_RDI,-0x16,0x5b7,"ARKodeSetConstraints",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                      ,"Illegal values in constraints vector.");
      local_4 = -0x16;
    }
    else {
      iVar1 = arkAllocVec(in_RSI,tmpl,(N_Vector *)in_RDI);
      if (iVar1 == 0) {
        local_4 = -0x14;
      }
      else {
        N_VScale(0x3ff0000000000000,in_RSI,in_RDI->constraints);
        in_RDI->constraintsSet = 1;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetConstraints(void* arkode_mem, N_Vector constraints)
{
  sunrealtype temptest;
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive && (constraints != NULL))
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* If there are no constraints, destroy data structures */
  if (constraints == NULL)
  {
    arkFreeVec(ark_mem, &ark_mem->constraints);
    ark_mem->constraintsSet = SUNFALSE;
    return (ARK_SUCCESS);
  }

  /* Test if required vector ops. are defined */
  if (constraints->ops->nvdiv == NULL || constraints->ops->nvmaxnorm == NULL ||
      constraints->ops->nvcompare == NULL ||
      constraints->ops->nvconstrmask == NULL ||
      constraints->ops->nvminquotient == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_NVECTOR);
    return (ARK_ILL_INPUT);
  }

  /* Check the constraints vector */
  temptest = N_VMaxNorm(constraints);
  if ((temptest > SUN_RCONST(2.5)) || (temptest < HALF))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_CONSTR);
    return (ARK_ILL_INPUT);
  }

  /* Allocate the internal constrains vector (if necessary) */
  if (!arkAllocVec(ark_mem, constraints, &ark_mem->constraints))
  {
    return (ARK_MEM_FAIL);
  }

  /* Load the constraints vector */
  N_VScale(ONE, constraints, ark_mem->constraints);
  ark_mem->constraintsSet = SUNTRUE;

  return (ARK_SUCCESS);
}